

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

planck_unit_suite_t * cpp_wrapper1_getsuite_2(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_master_table_delete,"test_master_table_delete",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_master_table_dictionary_create_delete_all_1,
             "test_master_table_dictionary_create_delete_all_1",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_master_table_dictionary_create_delete_all_2,
             "test_master_table_dictionary_create_delete_all_2",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_delete_all_all,"test_static_delete_all_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper1_getsuite_2(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_master_table_delete);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_master_table_dictionary_create_delete_all_1);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_master_table_dictionary_create_delete_all_2);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_delete_all_all);

	return suite;
}